

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicNeuron.cpp
# Opt level: O3

void __thiscall BasicNeuron::ProcessInputSpike(BasicNeuron *this)

{
  *(undefined4 *)&this->field_0xbc = 0;
  this->field_0xc8 = 1;
  this->grad = 0.0;
  *(undefined8 *)&this->field_0xcc = 0;
  return;
}

Assistant:

void BasicNeuron::Reset()
{
    potential = 0;
    consistent = true;
    grad = 0;
    inputSpikeCounter = 0;
    outputSpikeCounter = 0;
    grad = 0;
}